

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_CheckEqualFailureWithText_Test::~TEST_TestFailure_CheckEqualFailureWithText_Test
          (TEST_TestFailure_CheckEqualFailureWithText_Test *this)

{
  TEST_TestFailure_CheckEqualFailureWithText_Test *this_local;
  
  ~TEST_TestFailure_CheckEqualFailureWithText_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestFailure, CheckEqualFailureWithText)
{
    CheckEqualFailure f(test, failFileName, failLineNumber, "expected", "actual", "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <expected>\n"
                  "\tbut was  <actual>\n"
                  "\tdifference starts at position 0 at: <          actual    >\n"
                  "\t                                               ^", f);
}